

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warshall.c
# Opt level: O2

void reflexive_transitive_closure(uint *R,int n)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  transitive_closure(R,n);
  iVar3 = (n + 0x1f) / 0x20;
  puVar1 = R + n * iVar3;
  uVar4 = 1;
  for (; R < puVar1; R = R + (ulong)(iVar2 == 0) + (long)iVar3) {
    *R = *R | uVar4;
    iVar2 = uVar4 * 2;
    uVar4 = iVar2 + (uint)(iVar2 == 0);
  }
  return;
}

Assistant:

void reflexive_transitive_closure(unsigned *R, int n)
{
    register int rowsize;
    register unsigned mask;
    register unsigned *rp;
    register unsigned *relend;

    transitive_closure(R, n);

    rowsize = WORDSIZE(n);
    relend = R + n*rowsize;

    mask = 1;
    rp = R;
    while (rp < relend)
    {
	*rp |= mask;
	mask <<= 1;
	if (mask == 0)
	{
	    mask = 1;
	    rp++;
	}

	rp += rowsize;
    }
}